

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O3

CVmUndoRecord * __thiscall CVmUndo::add_new_record(CVmUndo *this,vm_obj_id_t controlling_obj)

{
  uint uVar1;
  CVmUndoMeta *pCVar2;
  CVmUndoMeta *pCVar3;
  
  if (((controlling_obj != 0) && (this->savept_cnt_ != 0)) &&
     ((*(ushort *)&G_obj_table_X.pages_[controlling_obj >> 0xc][controlling_obj & 0xfff].field_0x14
      & 0xc0) == 0x40)) {
    uVar1 = this->savept_cnt_;
    while ((uVar1 != 0 && (this->next_free_ == this->oldest_first_))) {
      drop_oldest_savept(this);
      if (uVar1 == 1) {
        return (CVmUndoRecord *)0x0;
      }
      uVar1 = this->savept_cnt_;
    }
    pCVar2 = this->next_free_;
    pCVar3 = pCVar2 + 1;
    if (pCVar3 == this->rec_arr_ + this->rec_arr_size_) {
      pCVar3 = this->rec_arr_;
    }
    this->next_free_ = pCVar3;
    return (CVmUndoRecord *)pCVar2;
  }
  return (CVmUndoRecord *)0x0;
}

Assistant:

CVmUndoRecord *CVmUndo::add_new_record(VMG_ vm_obj_id_t controlling_obj)
{
    CVmUndoMeta *meta;
    
    /* if there is not an active savepoint, do not keep undo */
    if (savept_cnt_ == 0)
        return 0;

    /* 
     *   if the object was created after the current savepoint was created,
     *   there is no need to keep undo for it during this savepoint, since
     *   rolling back to the savepoint will roll back to a point at which
     *   the object didn't even exist 
     */
    if (!G_obj_table->is_obj_in_undo(controlling_obj))
        return 0;
    
    /* allocate a new record */
    meta = alloc_rec(vmg0_);
    
    /* return the undo record, if we succeeded */
    return (meta == 0 ? 0 : &meta->rec);
}